

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O1

void array_negation_test(void)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  array_container_t *container;
  bitset_container_t *dst;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  ushort uVar7;
  int x;
  uint uVar8;
  ulong unaff_R13;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  
  container = array_container_create();
  uVar7 = 0;
  dst = bitset_container_create();
  uVar10 = 0;
  do {
    iVar5 = container->cardinality;
    if (((long)iVar5 == 0) ||
       ((iVar5 != 0x7fffffff && (container->array[(long)iVar5 + -1] < uVar7)))) {
      if (iVar5 == container->capacity) {
        array_container_grow(container,container->capacity + 1,true);
      }
      iVar5 = container->cardinality;
      container->cardinality = iVar5 + 1;
      container->array[iVar5] = uVar7;
    }
    else {
      iVar6 = iVar5 + -1;
      uVar9 = 0;
      do {
        if (iVar6 < (int)uVar9) {
          unaff_R13 = (ulong)~uVar9;
          break;
        }
        uVar8 = uVar9 + iVar6 >> 1;
        uVar1 = *(ushort *)((long)container->array + (ulong)(uVar9 + iVar6 & 0xfffffffe));
        if (uVar1 < uVar7) {
          uVar9 = uVar8 + 1;
          bVar3 = true;
        }
        else if (uVar7 < uVar1) {
          iVar6 = uVar8 - 1;
          bVar3 = true;
        }
        else {
          bVar3 = false;
          unaff_R13 = (ulong)uVar8;
        }
      } while (bVar3);
      if ((iVar5 != 0x7fffffff) && ((int)(uint)unaff_R13 < 0)) {
        if (iVar5 == container->capacity) {
          array_container_grow(container,container->capacity + 1,true);
        }
        uVar9 = ~(uint)unaff_R13;
        unaff_R13 = (ulong)uVar9;
        memmove(container->array + unaff_R13 + 1,container->array + unaff_R13,
                (long)(int)(iVar5 - uVar9) * 2);
        container->array[unaff_R13] = uVar7;
        container->cardinality = container->cardinality + 1;
      }
    }
    uVar9 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar9;
    uVar7 = uVar7 + 0x1d;
  } while (uVar9 != 0x8d4);
  array_container_negation(container,dst);
  _assert_int_equal((long)dst->cardinality,0xf72c,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                    ,0x56b);
  uVar9 = 0;
  do {
    if (uVar9 * 0x4f72c235 < 0x8d3dcb1) {
      uVar4 = ~dst->words[uVar9 >> 6];
      iVar5 = 0x56f;
    }
    else {
      uVar4 = dst->words[uVar9 >> 6];
      iVar5 = 0x571;
    }
    _assert_true((ulong)((uVar4 >> (uVar9 & 0x3f) & 1) != 0),
                 "bitset_container_contains(BO, (uint16_t)x)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/mixed_container_unit.c"
                 ,iVar5);
    iVar5 = container->cardinality;
    uVar7 = (ushort)uVar9;
    if (((long)iVar5 == 0) ||
       ((iVar5 != 0x7fffffff && (container->array[(long)iVar5 + -1] < uVar7)))) {
      if (iVar5 == container->capacity) {
        array_container_grow(container,container->capacity + 1,true);
      }
      iVar5 = container->cardinality;
      container->cardinality = iVar5 + 1;
      container->array[iVar5] = uVar7;
    }
    else {
      iVar6 = iVar5 + -1;
      uVar8 = 0;
      uVar11 = uVar10;
      do {
        if (iVar6 < (int)uVar8) {
          uVar10 = (ulong)~uVar8;
          break;
        }
        uVar2 = uVar8 + iVar6 >> 1;
        uVar10 = (ulong)uVar2;
        uVar1 = *(ushort *)((long)container->array + (ulong)(uVar8 + iVar6 & 0xfffffffe));
        if (uVar1 < uVar7) {
          uVar8 = uVar2 + 1;
          bVar3 = true;
          uVar10 = uVar11;
        }
        else if (uVar7 < uVar1) {
          iVar6 = uVar2 - 1;
          bVar3 = true;
          uVar10 = uVar11;
        }
        else {
          bVar3 = false;
        }
        uVar11 = uVar10;
      } while (bVar3);
      if ((iVar5 != 0x7fffffff) && ((int)(uint)uVar10 < 0)) {
        if (iVar5 == container->capacity) {
          array_container_grow(container,container->capacity + 1,true);
        }
        uVar8 = ~(uint)uVar10;
        uVar10 = (ulong)uVar8;
        memmove(container->array + uVar10 + 1,container->array + uVar10,
                (long)(int)(iVar5 - uVar8) * 2);
        container->array[uVar10] = uVar7;
        container->cardinality = container->cardinality + 1;
      }
    }
    uVar9 = uVar9 + 1;
    if (uVar9 == 0x10000) {
      array_container_free(container);
      bitset_container_free(dst);
      return;
    }
  } while( true );
}

Assistant:

DEFINE_TEST(array_negation_test) {
    int ctr = 0;
    array_container_t* AI = array_container_create();
    bitset_container_t* BO = bitset_container_create();

    for (int x = 0; x < (1 << 16); x += 29) {
        array_container_add(AI, (uint16_t)x);
        ++ctr;
    }

    array_container_negation(AI, BO);
    assert_int_equal(bitset_container_cardinality(BO), (1 << 16) - ctr);

    for (int x = 0; x < (1 << 16); x++) {
        if (x % 29 == 0) {
            assert_false(bitset_container_contains(BO, (uint16_t)x));
        } else {
            assert_true(bitset_container_contains(BO, (uint16_t)x));
        }
        array_container_add(AI, (uint16_t)x);
        ++ctr;
    }

    array_container_free(AI);
    bitset_container_free(BO);
}